

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O3

uint TryLowerConstantToMemory(RegVmLoweredBlock *lowBlock,VmValue *value)

{
  VmValueType VVar1;
  RegVmLoweredModule *pRVar2;
  ulong in_RAX;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  SmallArray<unsigned_int,_256U> *this;
  uint uVar7;
  undefined8 uVar8;
  undefined8 uStack_38;
  
  if (value == (VmValue *)0x0) {
    return 0;
  }
  if (value->typeID != 1) {
    return 0;
  }
  pRVar2 = lowBlock->parent->parent;
  VVar1 = (value->type).type;
  uVar7 = (value->type).size;
  uStack_38 = in_RAX;
  if ((VVar1 == VM_TYPE_INT) && (uVar7 == 4)) {
    uVar7 = *(uint *)&value[1]._vptr_VmValue;
    uVar5 = (pRVar2->constants).count;
    if ((ulong)uVar5 != 0) {
      uVar6 = 0;
      do {
        if ((pRVar2->constants).data[uVar6] == uVar7) {
          return (int)uVar6 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    if (uVar5 == (pRVar2->constants).max) {
      SmallArray<unsigned_int,_256U>::grow(&pRVar2->constants,uVar5);
    }
    puVar3 = (pRVar2->constants).data;
    if (puVar3 != (uint *)0x0) {
      uVar4 = (pRVar2->constants).count;
      (pRVar2->constants).count = uVar4 + 1;
      puVar3[uVar4] = uVar7;
      return uVar5 + 1;
    }
    goto LAB_002639d3;
  }
  if ((VVar1 == VM_TYPE_DOUBLE) && (uVar7 == 8)) {
    uVar8 = *(undefined8 *)&value[1].typeID;
    uVar5 = (uint)((ulong)uVar8 >> 0x20);
    uVar7 = (pRVar2->constants).count;
    if (1 < uVar7) {
      puVar3 = (pRVar2->constants).data;
      uVar4 = 1;
      do {
        if ((puVar3[uVar4 - 1] == (uint)uVar8) && (puVar3[uVar4] == uVar5)) {
          return uVar4;
        }
        uVar4 = uVar4 + 2;
      } while (uVar4 < uVar7);
    }
    if ((uVar7 & 1) != 0) {
      if (uVar7 == (pRVar2->constants).max) {
        SmallArray<unsigned_int,_256U>::grow(&pRVar2->constants,uVar7);
      }
      puVar3 = (pRVar2->constants).data;
      if (puVar3 == (uint *)0x0) goto LAB_002639d3;
      uVar7 = (pRVar2->constants).count;
      (pRVar2->constants).count = uVar7 + 1;
      puVar3[uVar7] = 0;
LAB_002638c9:
      uVar7 = (pRVar2->constants).count;
      uVar5 = (uint)((ulong)uVar8 >> 0x20);
    }
  }
  else {
    if ((VVar1 != VM_TYPE_LONG) || (uVar7 != 8)) {
      if (VVar1 == VM_TYPE_STRUCT) {
        if ((uVar7 & 3) != 0) {
          __assert_fail("constant->type.size % 4 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0x22f,
                        "unsigned int TryLowerConstantToMemory(RegVmLoweredBlock *, VmValue *)");
        }
        uVar5 = (pRVar2->constants).count + 1;
        if (uVar7 < 4) {
          return uVar5;
        }
        uVar6 = 0;
        while( true ) {
          uVar7 = *(uint *)((long)&(value[1].type.structType)->_vptr_TypeBase + uVar6 * 4);
          uVar4 = (pRVar2->constants).count;
          if (uVar4 == (pRVar2->constants).max) {
            SmallArray<unsigned_int,_256U>::grow(&pRVar2->constants,uVar4);
          }
          puVar3 = (pRVar2->constants).data;
          if (puVar3 == (uint *)0x0) break;
          uVar4 = (pRVar2->constants).count;
          (pRVar2->constants).count = uVar4 + 1;
          puVar3[uVar4] = uVar7;
          uVar6 = uVar6 + 1;
          if ((value->type).size >> 2 <= uVar6) {
            return uVar5;
          }
        }
        goto LAB_002639d3;
      }
      if (VVar1 != VM_TYPE_POINTER) {
        return 0;
      }
      if (value[1].comment.end != (char *)0x0) {
        return 0;
      }
      if (*(int *)&value[1]._vptr_VmValue != 0) {
        __assert_fail("constant->iValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x219,"unsigned int TryLowerConstantToMemory(RegVmLoweredBlock *, VmValue *)"
                     );
      }
    }
    uVar8._0_4_ = value[1].type.type;
    uVar8._4_4_ = value[1].type.size;
    uVar7 = (pRVar2->constants).count;
    if (1 < uVar7) {
      puVar3 = (pRVar2->constants).data;
      uVar5 = 1;
      do {
        if ((puVar3[uVar5 - 1] == (undefined4)uVar8) && (puVar3[uVar5] == uVar8._4_4_)) {
          return uVar5;
        }
        uVar5 = uVar5 + 2;
      } while (uVar5 < uVar7);
    }
    uVar5 = uVar8._4_4_;
    if ((uVar7 & 1) != 0) {
      uStack_38 = in_RAX & 0xffffffff;
      SmallArray<unsigned_int,_256U>::push_back(&pRVar2->constants,(uint *)((long)&uStack_38 + 4));
      goto LAB_002638c9;
    }
  }
  this = &pRVar2->constants;
  if (uVar7 == (pRVar2->constants).max) {
    SmallArray<unsigned_int,_256U>::grow(this,uVar7);
  }
  puVar3 = this->data;
  if (puVar3 != (uint *)0x0) {
    uVar4 = (pRVar2->constants).count;
    (pRVar2->constants).count = uVar4 + 1;
    puVar3[uVar4] = (uint)uVar8;
    uVar4 = (pRVar2->constants).count;
    if (uVar4 == (pRVar2->constants).max) {
      SmallArray<unsigned_int,_256U>::grow(this,uVar4);
      puVar3 = this->data;
      if (puVar3 == (uint *)0x0) goto LAB_002639d3;
    }
    uVar4 = (pRVar2->constants).count;
    (pRVar2->constants).count = uVar4 + 1;
    puVar3[uVar4] = uVar5;
    return uVar7 + 1;
  }
LAB_002639d3:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<unsigned int, 256>::push_back(const T &) [T = unsigned int, N = 256]"
               );
}

Assistant:

unsigned TryLowerConstantToMemory(RegVmLoweredBlock *lowBlock, VmValue *value)
{
	if(VmConstant *constant = getType<VmConstant>(value))
	{
		RegVmLoweredModule *lowModule = lowBlock->parent->parent;

		if(constant->type == VmType::Int || (constant->type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4 && !constant->container))
		{
			if(constant->type.type == VM_TYPE_POINTER)
				assert(constant->iValue == 0);

			if(unsigned index = lowModule->FindConstant(constant->iValue))
				return index;

			unsigned index = lowModule->constants.size() + 1;

			lowModule->constants.push_back(constant->iValue);

			return index;
		}
		else if(constant->type == VmType::Double)
		{
			unsigned data[2];
			memcpy(data, &constant->dValue, 8);

			if(unsigned index = lowModule->FindConstant(data[0], data[1]))
				return index;

			if(lowModule->constants.size() % 2 != 0)
				lowModule->constants.push_back(0);

			unsigned index = lowModule->constants.size() + 1;

			lowModule->constants.push_back(data[0]);
			lowModule->constants.push_back(data[1]);

			return index;
		}
		else if(constant->type == VmType::Long || (constant->type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8 && !constant->container))
		{
			if(constant->type.type == VM_TYPE_POINTER)
				assert(constant->iValue == 0);

			unsigned data[2];
			memcpy(data, &constant->lValue, 8);

			if(unsigned index = lowModule->FindConstant(data[0], data[1]))
				return index;

			if(lowModule->constants.size() % 2 != 0)
				lowModule->constants.push_back(0);

			unsigned index = lowModule->constants.size() + 1;

			lowModule->constants.push_back(data[0]);
			lowModule->constants.push_back(data[1]);

			return index;
		}
		else if(constant->type.type == VM_TYPE_STRUCT)
		{
			unsigned index = lowModule->constants.size() + 1;

			assert(constant->type.size % 4 == 0);

			for(unsigned i = 0; i < constant->type.size / 4; i++)
			{
				unsigned elementValue;
				memcpy(&elementValue, constant->sValue + i * 4, 4);
				lowModule->constants.push_back(elementValue);
			}

			return index;
		}
	}

	return 0;
}